

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderBuiltinVarTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::sr::anon_unknown_1::BuiltinInputVariationsCaseInstance::iterate
          (TestStatus *__return_storage_ptr__,BuiltinInputVariationsCaseInstance *this)

{
  TextureFormat TVar1;
  ushort uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  RGBA threshold;
  Surface refImage;
  Surface resImage;
  VkPushConstantRange pcRanges;
  deUint16 indices [12];
  UVec2 viewportSize;
  PixelBufferAccess local_e8;
  RGBA local_c0;
  RGBA local_bc;
  Surface local_b8;
  Surface local_a0;
  VkPushConstantRange local_88;
  deUint16 local_78 [12];
  int local_60;
  int local_5c;
  ConstPixelBufferAccess local_58;
  
  ShaderRenderCaseInstance::getViewportSize(&this->super_ShaderRenderCaseInstance);
  local_bc.m_value = 0x2020202;
  tcu::Surface::Surface(&local_a0,local_60,local_5c);
  tcu::Surface::Surface(&local_b8,local_60,local_5c);
  local_88.size = 0x10;
  local_88.stageFlags = 0x10;
  local_88.offset = 0;
  local_78[0] = 0;
  local_78[1] = 4;
  local_78[2] = 1;
  local_78[3] = 0;
  local_78[4] = 5;
  local_78[5] = 4;
  local_78[6] = 1;
  local_78[7] = 2;
  local_78[8] = 3;
  local_78[9] = 1;
  local_78[10] = 3;
  local_78[0xb] = 4;
  (*(this->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance[4])(this);
  if ((this->m_shaderInputTypes & 4) != 0) {
    ShaderRenderCaseInstance::setPushConstantRanges
              (&this->super_ShaderRenderCaseInstance,1,&local_88);
  }
  local_e8.super_ConstPixelBufferAccess.m_format.order = 0x3e000000;
  local_e8.super_ConstPixelBufferAccess.m_format.type = 0x3e800000;
  local_e8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0x3f000000;
  local_e8.super_ConstPixelBufferAccess.m_size.m_data[1] = 0x3f800000;
  ShaderRenderCaseInstance::render
            (&this->super_ShaderRenderCaseInstance,6,4,local_78,(Vec4 *)&local_e8);
  local_58.m_format.order = RGBA;
  local_58.m_format.type = UNORM_INT8;
  if ((void *)local_a0.m_pixels.m_cap != (void *)0x0) {
    local_a0.m_pixels.m_cap = (size_t)local_a0.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_e8,&local_58.m_format,local_a0.m_width,local_a0.m_height,1,
             (void *)local_a0.m_pixels.m_cap);
  tcu::TextureLevel::getAccess(&local_58,&(this->super_ShaderRenderCaseInstance).m_resultImage);
  tcu::copy((EVP_PKEY_CTX *)&local_e8,(EVP_PKEY_CTX *)&local_58);
  if (0 < local_b8.m_height) {
    iVar6 = 0;
    iVar5 = local_b8.m_height;
    iVar4 = local_b8.m_width;
    do {
      if (0 < iVar4) {
        iVar7 = 0;
        do {
          local_e8.super_ConstPixelBufferAccess.m_format.order = 0x3dcccccd;
          local_e8.super_ConstPixelBufferAccess.m_format.type = 0x3e4ccccd;
          local_e8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0x3e99999a;
          local_e8.super_ConstPixelBufferAccess.m_size.m_data[1] = 0x3f800000;
          uVar2 = this->m_shaderInputTypes;
          if ((iVar4 / 2 <= iVar7 & (byte)uVar2) == 0) {
            if ((uVar2 & 2) == 0) {
              local_e8.super_ConstPixelBufferAccess.m_format.order = 0x3e99999a;
              local_e8.super_ConstPixelBufferAccess.m_format.type = 0x3e4ccccd;
              local_e8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0x3ecccccd;
            }
            else {
              local_e8.super_ConstPixelBufferAccess.m_format.type =
                   (ChannelType)(((float)iVar7 + 0.5) / (float)iVar4);
              local_e8.super_ConstPixelBufferAccess.m_format.order =
                   (ChannelOrder)
                   ((1.0 - (float)local_e8.super_ConstPixelBufferAccess.m_format.type) * 0.6);
              local_e8.super_ConstPixelBufferAccess.m_format.type =
                   (ChannelType)((float)local_e8.super_ConstPixelBufferAccess.m_format.type * 0.6);
              local_e8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0x3e99999a;
            }
            local_e8.super_ConstPixelBufferAccess.m_format.type =
                 (ChannelType)((float)local_e8.super_ConstPixelBufferAccess.m_format.type + 0.2);
            local_e8.super_ConstPixelBufferAccess.m_format.order =
                 (ChannelOrder)((float)local_e8.super_ConstPixelBufferAccess.m_format.order + 0.1);
            local_e8.super_ConstPixelBufferAccess.m_size.m_data[1] = 0x3f800000;
          }
          if ((uVar2 & 4) != 0) {
            local_e8.super_ConstPixelBufferAccess.m_format.order =
                 (ChannelOrder)
                 ((this->m_constantColor).m_data[0] +
                 (float)local_e8.super_ConstPixelBufferAccess.m_format.order);
            local_e8.super_ConstPixelBufferAccess.m_format.type =
                 (ChannelType)
                 ((this->m_constantColor).m_data[1] +
                 (float)local_e8.super_ConstPixelBufferAccess.m_format.type);
            local_e8.super_ConstPixelBufferAccess.m_size.m_data[1] =
                 (int)((this->m_constantColor).m_data[3] +
                      (float)local_e8.super_ConstPixelBufferAccess.m_size.m_data[1]);
            local_e8.super_ConstPixelBufferAccess.m_size.m_data[0] =
                 (int)((this->m_constantColor).m_data[2] +
                      (float)local_e8.super_ConstPixelBufferAccess.m_size.m_data[0]);
          }
          tcu::RGBA::RGBA(&local_c0,(Vec4 *)&local_e8);
          *(deUint32 *)
           ((long)local_b8.m_pixels.m_ptr + (long)(local_b8.m_width * iVar6 + iVar7) * 4) =
               local_c0.m_value;
          iVar7 = iVar7 + 1;
          iVar5 = local_b8.m_height;
          iVar4 = local_b8.m_width;
        } while (iVar7 < local_b8.m_width);
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 < iVar5);
  }
  bVar3 = tcu::pixelThresholdCompare
                    (((this->super_ShaderRenderCaseInstance).super_TestInstance.m_context)->
                     m_testCtx->m_log,"Result","Image comparison result",&local_b8,&local_a0,
                     &local_bc,COMPARE_LOG_RESULT);
  TVar1 = (TextureFormat)(local_e8.super_ConstPixelBufferAccess.m_size.m_data + 2);
  local_e8.super_ConstPixelBufferAccess.m_format = TVar1;
  if (bVar3) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"Result image matches reference","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,
               local_e8.super_ConstPixelBufferAccess.m_format,
               (undefined1 *)
               (local_e8.super_ConstPixelBufferAccess.m_size.m_data._0_8_ +
               (long)local_e8.super_ConstPixelBufferAccess.m_format));
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Image mismatch","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,
               local_e8.super_ConstPixelBufferAccess.m_format,
               (undefined1 *)
               (local_e8.super_ConstPixelBufferAccess.m_size.m_data._0_8_ +
               (long)local_e8.super_ConstPixelBufferAccess.m_format));
  }
  if (local_e8.super_ConstPixelBufferAccess.m_format != TVar1) {
    operator_delete((void *)local_e8.super_ConstPixelBufferAccess.m_format,
                    local_e8.super_ConstPixelBufferAccess._16_8_ + 1);
  }
  tcu::Surface::~Surface(&local_b8);
  tcu::Surface::~Surface(&local_a0);
  return __return_storage_ptr__;
}

Assistant:

TestStatus BuiltinInputVariationsCaseInstance::iterate (void)
{
	const UVec2					viewportSize	= getViewportSize();
	const int					width			= viewportSize.x();
	const int					height			= viewportSize.y();
	const tcu::RGBA				threshold		(2, 2, 2, 2);
	Surface						resImage		(width, height);
	Surface						refImage		(width, height);
	bool						compareOk		= false;
	const VkPushConstantRange	pcRanges		=
	{
		VK_SHADER_STAGE_FRAGMENT_BIT,	// VkShaderStageFlags	stageFlags;
		0u,								// deUint32				offset;
		sizeof(Vec4)					// deUint32				size;
	};
	const deUint16				indices[12]		=
	{
		0, 4, 1,
		0, 5, 4,
		1, 2, 3,
		1, 3, 4
	};

	setup();

	if (m_shaderInputTypes & SHADER_INPUT_CONSTANT_BIT)
		setPushConstantRanges(1, &pcRanges);

	render(6, 4, indices);
	copy(resImage.getAccess(), getResultImage().getAccess());

	// Reference image
	for (int y = 0; y < refImage.getHeight(); y++)
	{
		for (int x = 0; x < refImage.getWidth(); x++)
		{
			Vec4 color (0.1f, 0.2f, 0.3f, 1.0f);

			if (((m_shaderInputTypes & SHADER_INPUT_BUILTIN_BIT) && (x < refImage.getWidth() / 2)) ||
				!(m_shaderInputTypes & SHADER_INPUT_BUILTIN_BIT))
			{
				if (m_shaderInputTypes & SHADER_INPUT_VARYING_BIT)
				{
					const float xf = (float(x)+.5f) / float(refImage.getWidth());
					color += Vec4(0.6f * (1 - xf), 0.6f * xf, 0.0f, 0.0f);
				}
				else
					color += Vec4(0.3f, 0.2f, 0.1f, 0.0f);
			}

			if (m_shaderInputTypes & SHADER_INPUT_CONSTANT_BIT)
				color += m_constantColor;

			refImage.setPixel(x, y, RGBA(color));
		}
	}

	compareOk = pixelThresholdCompare(m_context.getTestContext().getLog(), "Result", "Image comparison result", refImage, resImage, threshold, COMPARE_LOG_RESULT);

	if (compareOk)
		return TestStatus::pass("Result image matches reference");
	else
		return TestStatus::fail("Image mismatch");
}